

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poptconfig.c
# Opt level: O2

int poptReadConfigFiles(poptContext con,char *paths)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  poptContext con_00;
  char *pcVar5;
  char ***in_RCX;
  uint uVar6;
  poptContext ppVar7;
  long lVar8;
  int ac;
  void *local_40;
  poptContext local_38;
  
  uVar6 = 0;
  if (paths == (char *)0x0) {
    con_00 = (poptContext)0x0;
  }
  else {
    sVar4 = strlen(paths);
    con_00 = (poptContext)malloc(sVar4 + 1);
    if (con_00 == (poptContext)0x0) {
      fwrite("virtual memory exhausted.\n",0x1a,1,_stderr);
      exit(1);
    }
    strcpy((char *)con_00,paths);
  }
  local_38 = con_00;
  while ((con_00 != (poptContext)0x0 && ((char)con_00->optionStack[0].argc != '\0'))) {
    local_40 = (void *)0x0;
    ac = 0;
    pcVar5 = strchr((char *)con_00,0x3a);
    if ((pcVar5 == (char *)0x0) || (*pcVar5 != ':')) {
      sVar4 = strlen((char *)con_00);
      ppVar7 = (poptContext)((long)&con_00->optionStack[0].argc + sVar4);
    }
    else {
      ppVar7 = (poptContext)(pcVar5 + 1);
      *pcVar5 = '\0';
    }
    poptGlob(con_00,(char *)&ac,(int *)&local_40,in_RCX);
    for (lVar8 = 0; lVar8 < ac; lVar8 = lVar8 + 1) {
      pcVar5 = *(char **)((long)local_40 + lVar8 * 8);
      iVar2 = poptSaneFile(pcVar5);
      if (iVar2 != 0) {
        uVar3 = poptReadConfigFile(con,pcVar5);
        uVar1 = uVar6;
        if (uVar6 == 0) {
          uVar1 = uVar3;
        }
        in_RCX = (char ***)(ulong)uVar1;
        if (uVar3 != 0) {
          uVar6 = uVar1;
        }
        free(*(void **)((long)local_40 + lVar8 * 8));
        *(undefined8 *)((long)local_40 + lVar8 * 8) = 0;
      }
    }
    free(local_40);
    con_00 = ppVar7;
  }
  free(local_38);
  return uVar6;
}

Assistant:

int poptReadConfigFiles(poptContext con, const char * paths)
{
    char * buf = (paths ? xstrdup(paths) : NULL);
    const char * p;
    char * pe;
    int rc = 0;		/* assume success */

    for (p = buf; p != NULL && *p != '\0'; p = pe) {
	const char ** av = NULL;
	int ac = 0;
	int i;
	int xx;

	/* locate start of next path element */
	pe = strchr(p, ':');
	if (pe != NULL && *pe == ':')
	    *pe++ = '\0';
	else
	    pe = (char *) (p + strlen(p));

	xx = poptGlob(con, p, &ac, &av);

	/* work-off each resulting file from the path element */
	for (i = 0; i < ac; i++) {
	    const char * fn = av[i];
	    if (!poptSaneFile(fn))
		continue;
	    xx = poptReadConfigFile(con, fn);
	    if (xx && rc == 0)
		rc = xx;
	    free((void *)av[i]);
	    av[i] = NULL;
	}
	free(av);
	av = NULL;
    }

    if (buf)
	free(buf);

    return rc;
}